

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlParserInputShrink(xmlParserInputPtr in)

{
  size_t sVar1;
  xmlChar *pxVar2;
  size_t ret;
  size_t used;
  xmlParserInputPtr in_local;
  
  if ((((in != (xmlParserInputPtr)0x0) && (in->buf != (xmlParserInputBufferPtr)0x0)) &&
      (in->base != (xmlChar *)0x0)) &&
     ((in->cur != (xmlChar *)0x0 && (in->buf->buffer != (xmlBufPtr)0x0)))) {
    ret = (long)in->cur - (long)in->base;
    if ((0xfa < ret) && (sVar1 = xmlBufShrink(in->buf->buffer,ret - 0x50), sVar1 != 0)) {
      ret = ret - sVar1;
      in->consumed = sVar1 + in->consumed;
    }
    sVar1 = xmlBufUse(in->buf->buffer);
    if (sVar1 < 0xfb) {
      xmlParserInputBufferRead(in->buf,500);
    }
    pxVar2 = xmlBufContent(in->buf->buffer);
    in->base = pxVar2;
    in->cur = in->base + ret;
    pxVar2 = xmlBufEnd(in->buf->buffer);
    in->end = pxVar2;
  }
  return;
}

Assistant:

void
xmlParserInputShrink(xmlParserInputPtr in) {
    size_t used;
    size_t ret;

#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext, "Shrink\n");
#endif
    if (in == NULL) return;
    if (in->buf == NULL) return;
    if (in->base == NULL) return;
    if (in->cur == NULL) return;
    if (in->buf->buffer == NULL) return;

    CHECK_BUFFER(in);

    used = in->cur - in->base;
    /*
     * Do not shrink on large buffers whose only a tiny fraction
     * was consumed
     */
    if (used > INPUT_CHUNK) {
	ret = xmlBufShrink(in->buf->buffer, used - LINE_LEN);
	if (ret > 0) {
            used -= ret;
	    in->consumed += ret;
	}
    }

    if (xmlBufUse(in->buf->buffer) <= INPUT_CHUNK) {
        xmlParserInputBufferRead(in->buf, 2 * INPUT_CHUNK);
    }

    in->base = xmlBufContent(in->buf->buffer);
    in->cur = in->base + used;
    in->end = xmlBufEnd(in->buf->buffer);

    CHECK_BUFFER(in);
}